

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_free_prop_enum(JSContext *ctx,JSPropertyEnum *tab,uint32_t len)

{
  uint in_EDX;
  JSContext *in_RSI;
  uint32_t i;
  uint uVar1;
  
  if (in_RSI != (JSContext *)0x0) {
    for (uVar1 = 0; uVar1 < in_EDX; uVar1 = uVar1 + 1) {
      JS_FreeAtom(in_RSI,in_EDX);
    }
    js_free(in_RSI,(void *)CONCAT44(in_EDX,uVar1));
  }
  return;
}

Assistant:

static void js_free_prop_enum(JSContext *ctx, JSPropertyEnum *tab, uint32_t len)
{
    uint32_t i;
    if (tab) {
        for(i = 0; i < len; i++)
            JS_FreeAtom(ctx, tab[i].atom);
        js_free(ctx, tab);
    }
}